

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void seto_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  UVar3 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (UVar3 == '\x01') {
LAB_0011dcf5:
      failDecode(pMyDisasm);
      return;
    }
  }
  else if (UVar3 == '\x01') {
    if (((pMyDisasm->Reserved_).VEX.L == '\0') && (((pMyDisasm->Reserved_).VEX.vvvv & 8) != 0)) {
      UVar3 = (pMyDisasm->Reserved_).VEX.pp;
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
        if (UVar3 == '\0') {
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovw",6);
          (pMyDisasm->Reserved_).MemDecoration = 0x66;
        }
        else {
          if (UVar3 != '\x01') goto LAB_0011dcf5;
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovb",6);
          (pMyDisasm->Reserved_).MemDecoration = 0x65;
        }
      }
      else if (UVar3 == '\0') {
        (pMyDisasm->Instruction).Category = 0x140000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovq",6);
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
      }
      else {
        if (UVar3 != '\x01') goto LAB_0011dcf5;
        (pMyDisasm->Instruction).Category = 0x140000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kmovd",6);
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
      }
      (pMyDisasm->Reserved_).Register_ = 0x400;
      GxEx(pMyDisasm);
      return;
    }
    goto LAB_0011dcf5;
  }
  (pMyDisasm->Instruction).Category = 0x10005;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"seto",5);
  (pMyDisasm->Reserved_).OperandSize = 8;
  (pMyDisasm->Reserved_).MemDecoration = 1;
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).OperandSize = 0x20;
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x5f].SF_;
  UVar4 = EFLAGS_TABLE[0x5f].ZF_;
  UVar5 = EFLAGS_TABLE[0x5f].AF_;
  UVar6 = EFLAGS_TABLE[0x5f].PF_;
  UVar7 = EFLAGS_TABLE[0x5f].CF_;
  UVar8 = EFLAGS_TABLE[0x5f].TF_;
  UVar9 = EFLAGS_TABLE[0x5f].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x5f].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x5f].NT_;
  UVar4 = EFLAGS_TABLE[0x5f].RF_;
  UVar5 = EFLAGS_TABLE[0x5f].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x5f].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ seto_(PDISASM pMyDisasm)
{
  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 0) &&
      (((GV.VEX.vvvv >> 3) & 0x1) == 1)
    ) {
    if (GV.REX.W_ == 0) {
      if (GV.VEX.pp == 1) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovb");
        #endif
        GV.MemDecoration = Arg2byte;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else if (GV.VEX.pp == 0) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovw");
        #endif
        GV.MemDecoration = Arg2word;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      if (GV.VEX.pp == 1) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovd");
        #endif
        GV.MemDecoration = Arg2dword;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else if (GV.VEX.pp == 0) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovq");
        #endif
        GV.MemDecoration = Arg2qword;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "seto");
    #endif
    GV.MemDecoration = Arg1byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
    GV.OperandSize = 32;
    GV.EIP_+= GV.DECALAGE_EIP+2;
    FillFlags(pMyDisasm,95);
  }
  else {
    failDecode(pMyDisasm);
  }
}